

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O3

Aig_Man_t *
Aig_ManScl(Aig_Man_t *pAig,int fLatchConst,int fLatchEqual,int fUseMvSweep,int nFramesSymb,
          int nFramesSatur,int fVerbose,int fVeryVerbose)

{
  void **ppvVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  int iVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  Aig_Man_t *pAVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  uint uVar10;
  ulong uVar11;
  Aig_Obj_t *pAVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  Aig_Obj_t **ppAVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  if ((pAig->vClockDoms != (Vec_Vec_t *)0x0) && (0 < pAig->vClockDoms->nSize)) {
    pAVar7 = Aig_ManSclPart(pAig,fLatchConst,fLatchEqual,fVerbose);
    return pAVar7;
  }
  if (pAig->vFlopNums != (Vec_Int_t *)0x0) {
    __assert_fail("pAig->vFlopNums == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigScl.c"
                  ,0x297,"Aig_Man_t *Aig_ManScl(Aig_Man_t *, int, int, int, int, int, int, int)");
  }
  pAVar7 = Aig_ManDupSimple(pAig);
  uVar10 = pAVar7->nRegs;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  uVar6 = 0x10;
  if (0xe < uVar10 - 1) {
    uVar6 = uVar10;
  }
  pVVar8->nCap = uVar6;
  if (uVar6 == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((long)(int)uVar6 << 2);
  }
  pVVar8->pArray = piVar9;
  pVVar8->nSize = uVar10;
  auVar5 = _DAT_008403e0;
  if (0 < (int)uVar10) {
    lVar14 = (ulong)uVar10 - 1;
    auVar17._8_4_ = (int)lVar14;
    auVar17._0_8_ = lVar14;
    auVar17._12_4_ = (int)((ulong)lVar14 >> 0x20);
    uVar11 = 0;
    auVar17 = auVar17 ^ _DAT_008403e0;
    auVar18 = _DAT_008403d0;
    do {
      auVar19 = auVar18 ^ auVar5;
      if ((bool)(~(auVar19._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar19._0_4_ ||
                  auVar17._4_4_ < auVar19._4_4_) & 1)) {
        piVar9[uVar11] = (int)uVar11;
      }
      if ((auVar19._12_4_ != auVar17._12_4_ || auVar19._8_4_ <= auVar17._8_4_) &&
          auVar19._12_4_ <= auVar17._12_4_) {
        piVar9[uVar11 + 1] = (int)uVar11 + 1;
      }
      uVar11 = uVar11 + 2;
      lVar14 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 2;
      auVar18._8_8_ = lVar14 + 2;
    } while ((uVar10 + 1 & 0xfffffffe) != uVar11);
  }
  pAVar7->vFlopNums = pVVar8;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(400);
  pVVar8->pArray = piVar9;
  pAVar7->vFlopReprs = pVVar8;
  Aig_ManSeqCleanup(pAVar7);
  if ((fLatchConst != 0) && (pAVar7->nRegs != 0)) {
    pAVar7 = Aig_ManConstReduce(pAVar7,fUseMvSweep,nFramesSymb,nFramesSatur,fVerbose,fVeryVerbose);
  }
  if ((fLatchEqual != 0) && (pAVar7->nRegs != 0)) {
    pAVar7 = Aig_ManReduceLaches(pAVar7,fVerbose);
  }
  iVar13 = pAig->nObjs[2] - pAig->nRegs;
  Aig_ManReprStart(pAig,pAig->vObjs->nSize);
  pVVar8 = pAVar7->vFlopReprs;
  iVar15 = pVVar8->nSize;
  if (0 < iVar15) {
    lVar14 = 1;
    do {
      if (iVar15 <= lVar14) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar10 = pVVar8->pArray[lVar14 + -1] + iVar13;
      if ((int)uVar10 < 0) {
LAB_00646a3e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar6 = pAig->vCis->nSize;
      if ((int)uVar6 <= (int)uVar10) goto LAB_00646a3e;
      iVar15 = pVVar8->pArray[lVar14];
      ppvVar1 = pAig->vCis->pArray;
      pAVar2 = (Aig_Obj_t *)ppvVar1[uVar10];
      ppAVar16 = &pAig->pConst1;
      if (iVar15 != -1) {
        uVar10 = iVar15 + iVar13;
        if (((int)uVar10 < 0) || (uVar6 <= uVar10)) goto LAB_00646a3e;
        ppAVar16 = (Aig_Obj_t **)(ppvVar1 + uVar10);
      }
      pAVar3 = *ppAVar16;
      if (pAVar2 == pAVar3) {
        __assert_fail("pFlop1 != pFlop2",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigScl.c"
                      ,0x2aa,"Aig_Man_t *Aig_ManScl(Aig_Man_t *, int, int, int, int, int, int, int)"
                     );
      }
      pAVar12 = pAVar2;
      iVar15 = pAVar3->Id;
      if (pAVar3->Id < pAVar2->Id) {
        pAVar12 = pAVar3;
        iVar15 = pAVar2->Id;
      }
      pAig->pReprs[iVar15] = pAVar12;
      pVVar8 = pAVar7->vFlopReprs;
      iVar15 = pVVar8->nSize;
      iVar4 = (int)lVar14;
      lVar14 = lVar14 + 2;
    } while (iVar4 + 1 < iVar15);
  }
  Aig_ManStop(pAVar7);
  pAVar7 = Aig_ManDupRepr(pAig,0);
  Aig_ManSeqCleanup(pAVar7);
  return pAVar7;
}

Assistant:

Aig_Man_t * Aig_ManScl( Aig_Man_t * pAig, int fLatchConst, int fLatchEqual, int fUseMvSweep, int nFramesSymb, int nFramesSatur, int fVerbose, int fVeryVerbose )
{
    extern void Saig_ManReportUselessRegisters( Aig_Man_t * pAig );
    extern int Saig_ManReportComplements( Aig_Man_t * p );

    Aig_Man_t * pAigInit, * pAigNew;
    Aig_Obj_t * pFlop1, * pFlop2;
    int i, Entry1, Entry2, nTruePis;//, nRegs;

    if ( pAig->vClockDoms && Vec_VecSize(pAig->vClockDoms) > 0 )
        return Aig_ManSclPart( pAig, fLatchConst, fLatchEqual, fVerbose);

    // store the original AIG
    assert( pAig->vFlopNums == NULL );
    pAigInit = pAig;
    pAig = Aig_ManDupSimple( pAig );
    // create storage for latch numbers
    pAig->vFlopNums = Vec_IntStartNatural( pAig->nRegs );
    pAig->vFlopReprs = Vec_IntAlloc( 100 );
    Aig_ManSeqCleanup( pAig );
    if ( fLatchConst && pAig->nRegs )
        pAig = Aig_ManConstReduce( pAig, fUseMvSweep, nFramesSymb, nFramesSatur, fVerbose, fVeryVerbose );
    if ( fLatchEqual && pAig->nRegs )
        pAig = Aig_ManReduceLaches( pAig, fVerbose );
    // translate pairs into reprs
    nTruePis = Aig_ManCiNum(pAigInit)-Aig_ManRegNum(pAigInit);
    Aig_ManReprStart( pAigInit, Aig_ManObjNumMax(pAigInit) );
    Vec_IntForEachEntry( pAig->vFlopReprs, Entry1, i )
    {
        Entry2 = Vec_IntEntry( pAig->vFlopReprs, ++i ); 
        pFlop1 = Aig_ManCi( pAigInit, nTruePis + Entry1 );
        pFlop2 = (Entry2 == -1)? Aig_ManConst1(pAigInit) : Aig_ManCi( pAigInit, nTruePis + Entry2 );
        assert( pFlop1 != pFlop2 );
        if ( pFlop1->Id > pFlop2->Id )
            pAigInit->pReprs[pFlop1->Id] = pFlop2;
        else
            pAigInit->pReprs[pFlop2->Id] = pFlop1;
    }
    Aig_ManStop( pAig );
//    Aig_ManSeqCleanup( pAigInit );
    pAigNew = Aig_ManDupRepr( pAigInit, 0 );
    Aig_ManSeqCleanup( pAigNew );

//    Saig_ManReportUselessRegisters( pAigNew );
    if ( Aig_ManRegNum(pAigNew) == 0 )
        return pAigNew;
//    nRegs = Saig_ManReportComplements( pAigNew );
//    if ( nRegs ) 
//    printf( "The number of complemented registers = %d.\n", nRegs );
    return pAigNew;
}